

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# malloc.hpp
# Opt level: O0

CSharedMemoryObject *
CorUnix::InternalNew<CorUnix::CSharedMemoryObject,CorUnix::CObjectType*,_CRITICAL_SECTION*>
          (CObjectType *arg1,_CRITICAL_SECTION *arg2)

{
  CSharedMemoryObject *pMem;
  _CRITICAL_SECTION *arg2_local;
  CObjectType *arg1_local;
  
  arg1_local = (CObjectType *)InternalMalloc(0x1c8);
  if ((CSharedMemoryObject *)arg1_local == (CSharedMemoryObject *)0x0) {
    arg1_local = (CObjectType *)0x0;
  }
  else {
    CSharedMemoryObject::CSharedMemoryObject((CSharedMemoryObject *)arg1_local,arg1,arg2);
  }
  return (CSharedMemoryObject *)arg1_local;
}

Assistant:

T* InternalNew(A1 arg1, A2 arg2)
    {
        INTERNAL_NEW_COMMON();
        return new (pMem) T(arg1, arg2);
    }